

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  pointer pVVar1;
  pointer pSVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *srcBasePtr;
  TestError *this_00;
  long lVar6;
  long lVar7;
  size_t outputNdx;
  ulong uVar8;
  long lVar5;
  
  iVar3 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pVVar1 = (this->m_outputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (this->m_outputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar4 = 0;
  }
  else {
    dVar4 = pVVar1->stride;
  }
  (**(code **)(lVar5 + 0x40))(0x90d2,(this->m_outputBuffer).super_ObjectWrapper.m_object);
  srcBasePtr = (void *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,(long)(int)(dVar4 * numValues),1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x42d);
  if (srcBasePtr != (void *)0x0) {
    lVar7 = 0x20;
    lVar6 = 0;
    uVar8 = 0;
    while( true ) {
      pSVar2 = (this->super_ShaderExecutor).m_outputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->super_ShaderExecutor).m_outputs.
                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38) <= uVar8
         ) break;
      copyFromBuffer((VarType *)((long)&(pSVar2->name)._M_dataplus._M_p + lVar7),
                     (VarLayout *)
                     ((long)&((this->m_outputLayout).
                              super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                              ._M_impl.super__Vector_impl_data._M_start)->offset + lVar6),numValues,
                     srcBasePtr,outputPtrs[uVar8]);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x38;
      lVar6 = lVar6 + 0xc;
    }
    (**(code **)(lVar5 + 0x1670))(0x90d2);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x442);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
             ,0x42e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const deUint32			buffer				= *m_outputBuffer;
	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues*outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outputBufferSize, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_outputs.size() == m_outputLayout.size());
		for (size_t outputNdx = 0; outputNdx < m_outputs.size(); ++outputNdx)
		{
			const glu::VarType&		varType		= m_outputs[outputNdx].varType;
			const VarLayout&		layout		= m_outputLayout[outputNdx];

			copyFromBuffer(varType, layout, numValues, mapPtr, outputPtrs[outputNdx]);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}